

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
AnalyzeShortFunctionDefinition
          (ExpressionContext *ctx,SynShortFunctionDefinition *syntax,TypeBase *type,
          ArrayView<ArgumentData> currArguments,IntrusiveList<MatchData> aliases)

{
  uint *this;
  uint index;
  TypeHandle *pTVar1;
  TypeBase *pTVar2;
  TypeFunction *argumentType;
  ExprBase *pEVar3;
  long lVar4;
  TypeBase **ppTVar5;
  uint uVar6;
  ulong uVar7;
  
  if ((type == (TypeBase *)0x0) || (type->typeID != 0x15)) {
    type = (TypeBase *)0x0;
  }
  uVar6 = 0;
  if (type != (TypeBase *)0x0) {
    index = currArguments.count;
    lVar4._0_4_ = type[1].typeID;
    lVar4._4_4_ = type[1].nameHash;
    if (lVar4 != 0) {
      uVar6 = 0;
      do {
        uVar6 = uVar6 + 1;
        lVar4 = *(long *)(lVar4 + 8);
      } while (lVar4 != 0);
    }
    if (index + 1 <= uVar6) {
      this = &type[1].typeID;
      if (type->isGeneric == true) {
        if (index != 0) {
          ppTVar5 = &(currArguments.data)->type;
          uVar7 = 0;
          do {
            pTVar1 = IntrusiveList<TypeHandle>::operator[]
                               ((IntrusiveList<TypeHandle> *)this,(uint)uVar7);
            pTVar2 = MatchGenericType(ctx,&syntax->super_SynBase,pTVar1->type,*ppTVar5,&aliases,
                                      false);
            if (pTVar2 == (TypeBase *)0x0) {
              return (ExprBase *)0x0;
            }
            uVar7 = uVar7 + 1;
            ppTVar5 = ppTVar5 + 6;
          } while ((currArguments._8_8_ & 0xffffffff) != uVar7);
        }
        pTVar1 = IntrusiveList<TypeHandle>::operator[]((IntrusiveList<TypeHandle> *)this,index);
        argumentType = (TypeFunction *)
                       ResolveGenericTypeAliases(ctx,&syntax->super_SynBase,pTVar1->type,aliases);
      }
      else {
        pTVar1 = IntrusiveList<TypeHandle>::operator[]((IntrusiveList<TypeHandle> *)this,index);
        argumentType = (TypeFunction *)pTVar1->type;
      }
      if ((argumentType == (TypeFunction *)0x0) || ((argumentType->super_TypeBase).typeID != 0x15))
      {
        argumentType = (TypeFunction *)0x0;
      }
      if (argumentType != (TypeFunction *)0x0) {
        pEVar3 = AnalyzeShortFunctionDefinition(ctx,syntax,(FunctionData *)0x0,argumentType);
        return pEVar3;
      }
    }
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* AnalyzeShortFunctionDefinition(ExpressionContext &ctx, SynShortFunctionDefinition *syntax, TypeBase *type, ArrayView<ArgumentData> currArguments, IntrusiveList<MatchData> aliases)
{
	TypeFunction *functionType = getType<TypeFunction>(type);

	// Only applies to function calls
	if(!functionType)
		return NULL;

	IntrusiveList<TypeHandle> &fuctionArgs = functionType->arguments;

	// Function doesn't accept any more arguments
	if(currArguments.size() + 1 > fuctionArgs.size())
		return NULL;

	// Get current argument type
	TypeBase *target = NULL;

	if(functionType->isGeneric)
	{
		// Collect aliases up to the current argument
		for(unsigned i = 0; i < currArguments.size(); i++)
		{
			// Exit if the arguments before the short inline function fail to match
			if(!MatchGenericType(ctx, syntax, fuctionArgs[i]->type, currArguments[i].type, aliases, false))
				return NULL;
		}

		target = ResolveGenericTypeAliases(ctx, syntax, fuctionArgs[currArguments.size()]->type, aliases);
	}
	else
	{
		target = fuctionArgs[currArguments.size()]->type;
	}

	TypeFunction *argumentType = getType<TypeFunction>(target);

	if(!argumentType)
		return NULL;

	return AnalyzeShortFunctionDefinition(ctx, syntax, NULL, argumentType);
}